

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

int32_t icu_63::TimeZoneFormat::parseAbuttingAsciiOffsetFields
                  (UnicodeString *text,ParsePosition *pos,OffsetFields minFields,
                  OffsetFields maxFields,UBool fixedHourWidth)

{
  short sVar1;
  int iVar2;
  char16_t cVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int32_t digits [6];
  
  iVar2 = pos->index;
  iVar7 = (minFields * 2 - (uint)(fixedHourWidth == '\0')) + 2;
  uVar5 = maxFields * 2 + 2;
  digits[0] = 0;
  digits[1] = 0;
  digits[2] = 0;
  digits[3] = 0;
  digits[4] = 0;
  digits[5] = 0;
  uVar12 = 0;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = uVar12;
  }
  for (; uVar6 != uVar12; uVar12 = uVar12 + 1) {
    sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (text->fUnion).fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    iVar8 = iVar2 + (int)uVar12;
    if (iVar4 <= iVar8) {
LAB_001fe253:
      uVar6 = uVar12 & 0xffffffff;
      break;
    }
    cVar3 = UnicodeString::doCharAt(text,iVar8);
    iVar4 = (ushort)cVar3 - 0x30;
    if (9 < (ushort)(cVar3 + L'￐')) {
      iVar4 = -1;
    }
    if (iVar4 < 0) goto LAB_001fe253;
    digits[uVar12] = iVar4;
  }
  iVar4 = (int)uVar6 - (uint)((byte)uVar6 & fixedHourWidth != '\0');
  if (iVar7 <= iVar4) {
    iVar8 = digits[0] * 10 + digits[1];
    iVar9 = digits[2] * 10 + digits[3];
    iVar10 = digits[1] * 10 + digits[2];
    for (; iVar7 <= iVar4; iVar4 = iVar4 + (fixedHourWidth == '\0' | 0xfffffffe)) {
      iVar11 = 0;
      iVar13 = iVar8;
      iVar14 = iVar9;
      switch(iVar4) {
      case 1:
        iVar13 = digits[0];
        goto LAB_001fe315;
      case 2:
        goto LAB_001fe315;
      case 3:
        iVar13 = digits[0];
        iVar14 = iVar10;
        break;
      case 4:
        break;
      case 5:
        iVar11 = digits[3] * 10 + digits[4];
        iVar13 = digits[0];
        iVar14 = iVar10;
        break;
      case 6:
        iVar11 = digits[4] * 10 + digits[5];
        break;
      default:
        iVar13 = 0;
LAB_001fe315:
        iVar11 = 0;
        iVar14 = 0;
      }
      if (((iVar13 < 0x18) && (iVar14 < 0x3c)) && (iVar11 < 0x3c)) {
        pos->index = iVar2 + iVar4;
        return ((iVar13 * 0x3c + iVar14) * 0x3c + iVar11) * 1000;
      }
    }
  }
  pos->errorIndex = iVar2;
  return 0;
}

Assistant:

int32_t
TimeZoneFormat::parseAbuttingAsciiOffsetFields(const UnicodeString& text, ParsePosition& pos, OffsetFields minFields, OffsetFields maxFields, UBool fixedHourWidth) {
    int32_t start = pos.getIndex();

    int32_t minDigits = 2 * (minFields + 1) - (fixedHourWidth ? 0 : 1);
    int32_t maxDigits = 2 * (maxFields + 1);

    U_ASSERT(maxDigits <= MAX_OFFSET_DIGITS);

    int32_t digits[MAX_OFFSET_DIGITS] = {};
    int32_t numDigits = 0;
    int32_t idx = start;
    while (numDigits < maxDigits && idx < text.length()) {
        UChar uch = text.charAt(idx);
        int32_t digit = DIGIT_VAL(uch);
        if (digit < 0) {
            break;
        }
        digits[numDigits] = digit;
        numDigits++;
        idx++;
    }

    if (fixedHourWidth && (numDigits & 1)) {
        // Fixed digits, so the number of digits must be even number. Truncating.
        numDigits--;
    }

    if (numDigits < minDigits) {
        pos.setErrorIndex(start);
        return 0;
    }

    int32_t hour = 0, min = 0, sec = 0;
    UBool bParsed = FALSE;
    while (numDigits >= minDigits) {
        switch (numDigits) {
        case 1: //H
            hour = digits[0];
            break;
        case 2: //HH
            hour = digits[0] * 10 + digits[1];
            break;
        case 3: //Hmm
            hour = digits[0];
            min = digits[1] * 10 + digits[2];
            break;
        case 4: //HHmm
            hour = digits[0] * 10 + digits[1];
            min = digits[2] * 10 + digits[3];
            break;
        case 5: //Hmmss
            hour = digits[0];
            min = digits[1] * 10 + digits[2];
            sec = digits[3] * 10 + digits[4];
            break;
        case 6: //HHmmss
            hour = digits[0] * 10 + digits[1];
            min = digits[2] * 10 + digits[3];
            sec = digits[4] * 10 + digits[5];
            break;
        }

        if (hour <= MAX_OFFSET_HOUR && min <= MAX_OFFSET_MINUTE && sec <= MAX_OFFSET_SECOND) {
            // Successfully parsed
            bParsed = true;
            break;
        }

        // Truncating
        numDigits -= (fixedHourWidth ? 2 : 1);
        hour = min = sec = 0;
    }

    if (!bParsed) {
        pos.setErrorIndex(start);
        return 0;
    }
    pos.setIndex(start + numDigits);
    return ((((hour * 60) + min) * 60) + sec) * 1000;
}